

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::FuncTypeModuleField::~FuncTypeModuleField(FuncTypeModuleField *this)

{
  FuncTypeModuleField *this_local;
  
  ~FuncTypeModuleField(this);
  operator_delete(this);
  return;
}

Assistant:

explicit FuncTypeModuleField(const Location& loc = Location(),
                               string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::FuncType>(loc), func_type(name) {}